

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
          (QMovableArrayOps<QCss::BasicSelector> *this,qsizetype i,BasicSelector *args)

{
  qsizetype *pqVar1;
  BasicSelector **ppBVar2;
  BasicSelector *pBVar3;
  Relation RVar4;
  Data *pDVar5;
  BasicSelector *pBVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  Data *pDVar10;
  Data *pDVar11;
  Data *pDVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QArrayDataPointer<QString> local_88;
  QArrayDataPointer<QCss::Pseudo> QStack_70;
  QArrayDataPointer<QCss::AttributeSelector> local_58;
  Relation RStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
           super_QArrayDataPointer<QCss::BasicSelector>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0038520f:
    pDVar7 = (args->elementName).d.d;
    pcVar8 = (args->elementName).d.ptr;
    qVar9 = (args->elementName).d.size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    local_88.d = (args->ids).d.d;
    local_88.ptr = (args->ids).d.ptr;
    local_88.size = (args->ids).d.size;
    if (local_88.d != (Data *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QStack_70.d = (args->pseudos).d.d;
    QStack_70.ptr = (args->pseudos).d.ptr;
    QStack_70.size = (args->pseudos).d.size;
    if (QStack_70.d != (Data *)0x0) {
      LOCK();
      ((QStack_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.d = (args->attributeSelectors).d.d;
    local_58.ptr = (args->attributeSelectors).d.ptr;
    local_58.size = (args->attributeSelectors).d.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    RVar4 = args->relationToNext;
    _RStack_40 = CONCAT44(0xaaaaaaaa,RVar4);
    bVar13 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
             super_QArrayDataPointer<QCss::BasicSelector>.size != 0;
    QArrayDataPointer<QCss::BasicSelector>::detachAndGrow
              ((QArrayDataPointer<QCss::BasicSelector> *)this,(uint)(i == 0 && bVar13),1,
               (BasicSelector **)0x0,(QArrayDataPointer<QCss::BasicSelector> *)0x0);
    pBVar6 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
             super_QArrayDataPointer<QCss::BasicSelector>.ptr;
    if (i == 0 && bVar13) {
      pBVar6[-1].elementName.d.d = pDVar7;
      pBVar6[-1].elementName.d.ptr = pcVar8;
      pBVar6[-1].elementName.d.size = qVar9;
      pBVar6[-1].ids.d.d = local_88.d;
      pBVar6[-1].ids.d.ptr = local_88.ptr;
      pBVar6[-1].ids.d.size = local_88.size;
      pBVar6[-1].pseudos.d.d = QStack_70.d;
      pBVar6[-1].pseudos.d.ptr = QStack_70.ptr;
      pBVar6[-1].pseudos.d.size = QStack_70.size;
      pBVar6[-1].attributeSelectors.d.d = local_58.d;
      pBVar6[-1].attributeSelectors.d.ptr = local_58.ptr;
      pBVar6[-1].attributeSelectors.d.size = local_58.size;
      pBVar6[-1].relationToNext = RVar4;
      (this->super_QGenericArrayOps<QCss::BasicSelector>).
      super_QArrayDataPointer<QCss::BasicSelector>.ptr = pBVar6 + -1;
    }
    else {
      pBVar3 = pBVar6 + i;
      memmove(pBVar3 + 1,pBVar6 + i,
              ((this->super_QGenericArrayOps<QCss::BasicSelector>).
               super_QArrayDataPointer<QCss::BasicSelector>.size - i) * 0x68);
      (pBVar3->elementName).d.d = pDVar7;
      (pBVar3->elementName).d.ptr = pcVar8;
      (pBVar3->elementName).d.size = qVar9;
      (pBVar3->ids).d.d = local_88.d;
      (pBVar3->ids).d.ptr = local_88.ptr;
      (pBVar3->ids).d.size = local_88.size;
      (pBVar3->pseudos).d.d = QStack_70.d;
      (pBVar3->pseudos).d.ptr = QStack_70.ptr;
      (pBVar3->pseudos).d.size = QStack_70.size;
      (pBVar3->attributeSelectors).d.d = local_58.d;
      (pBVar3->attributeSelectors).d.ptr = local_58.ptr;
      (pBVar3->attributeSelectors).d.size = local_58.size;
      pBVar3->relationToNext = RVar4;
    }
    local_58.size = 0;
    local_58.ptr = (AttributeSelector *)0x0;
    local_58.d = (Data *)0x0;
    QStack_70.size = 0;
    QStack_70.ptr = (Pseudo *)0x0;
    QStack_70.d = (Data *)0x0;
    local_88.size = 0;
    local_88.ptr = (QString *)0x0;
    local_88.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
              super_QArrayDataPointer<QCss::BasicSelector>.size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QCss::AttributeSelector>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<QCss::Pseudo>::~QArrayDataPointer(&QStack_70);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  }
  else {
    if (((this->super_QGenericArrayOps<QCss::BasicSelector>).
         super_QArrayDataPointer<QCss::BasicSelector>.size == i) &&
       (pBVar6 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
                 super_QArrayDataPointer<QCss::BasicSelector>.ptr,
       (pDVar5->super_QArrayData).alloc - i !=
       ((long)((long)pBVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       0x4ec4ec4ec4ec4ec5)) {
      pDVar7 = (args->elementName).d.d;
      pBVar6[i].elementName.d.d = pDVar7;
      pBVar6[i].elementName.d.ptr = (args->elementName).d.ptr;
      pBVar6[i].elementName.d.size = (args->elementName).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar10 = (args->ids).d.d;
      pBVar6[i].ids.d.d = pDVar10;
      pBVar6[i].ids.d.ptr = (args->ids).d.ptr;
      pBVar6[i].ids.d.size = (args->ids).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11 = (args->pseudos).d.d;
      pBVar6[i].pseudos.d.d = pDVar11;
      pBVar6[i].pseudos.d.ptr = (args->pseudos).d.ptr;
      pBVar6[i].pseudos.d.size = (args->pseudos).d.size;
      if (pDVar11 != (Data *)0x0) {
        LOCK();
        (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar12 = (args->attributeSelectors).d.d;
      pBVar6[i].attributeSelectors.d.d = pDVar12;
      pBVar6[i].attributeSelectors.d.ptr = (args->attributeSelectors).d.ptr;
      pBVar6[i].attributeSelectors.d.size = (args->attributeSelectors).d.size;
      if (pDVar12 != (Data *)0x0) {
        LOCK();
        (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pBVar6[i].relationToNext = args->relationToNext;
    }
    else {
      if ((i != 0) ||
         (pBVar6 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
                   super_QArrayDataPointer<QCss::BasicSelector>.ptr,
         (BasicSelector *)
         ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pBVar6))
      goto LAB_0038520f;
      pDVar7 = (args->elementName).d.d;
      pBVar6[-1].elementName.d.d = pDVar7;
      pBVar6[-1].elementName.d.ptr = (args->elementName).d.ptr;
      pBVar6[-1].elementName.d.size = (args->elementName).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar10 = (args->ids).d.d;
      pBVar6[-1].ids.d.d = pDVar10;
      pBVar6[-1].ids.d.ptr = (args->ids).d.ptr;
      pBVar6[-1].ids.d.size = (args->ids).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11 = (args->pseudos).d.d;
      pBVar6[-1].pseudos.d.d = pDVar11;
      pBVar6[-1].pseudos.d.ptr = (args->pseudos).d.ptr;
      pBVar6[-1].pseudos.d.size = (args->pseudos).d.size;
      if (pDVar11 != (Data *)0x0) {
        LOCK();
        (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar12 = (args->attributeSelectors).d.d;
      pBVar6[-1].attributeSelectors.d.d = pDVar12;
      pBVar6[-1].attributeSelectors.d.ptr = (args->attributeSelectors).d.ptr;
      pBVar6[-1].attributeSelectors.d.size = (args->attributeSelectors).d.size;
      if (pDVar12 != (Data *)0x0) {
        LOCK();
        (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pBVar6[-1].relationToNext = args->relationToNext;
      ppBVar2 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
                 super_QArrayDataPointer<QCss::BasicSelector>.ptr;
      *ppBVar2 = *ppBVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
              super_QArrayDataPointer<QCss::BasicSelector>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }